

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<unsigned_char,_unsigned_long,_12>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uchar *lhs,unsigned_long *rhs,unsigned_long *result)

{
  unsigned_long *in_RDX;
  ulong *in_RSI;
  byte *in_RDI;
  uchar tmp;
  
  if (*in_RSI <= (ulong)*in_RDI) {
    SafeCastHelper<unsigned_long,_unsigned_char,_0>::
    CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(*in_RDI - (char)*in_RSI,in_RDX);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, U& result ) SAFEINT_CPP_THROW
    {
        // both are unsigned - easy case
        if( rhs <= lhs )
        {
            T tmp = (T)(lhs - rhs);
            SafeCastHelper< U, T, GetCastMethod<U, T>::method >::template CastThrow<E>( tmp, result);
            return;
        }

        E::SafeIntOnOverflow();
    }